

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O0

void __thiscall BinGE<0,_4,_1>::BinGE(BinGE<0,_4,_1> *this,IntView<0> _x,IntView<4> _y,BoolView *_r)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  _func_int **in_RSI;
  Propagator *in_RDI;
  _func_int **in_R8;
  Propagator *in_R9;
  BoolView *in_stack_ffffffffffffff98;
  Propagator *p;
  Propagator *this_00;
  IntView<4> *in_stack_ffffffffffffffc0;
  
  Propagator::Propagator(in_R9);
  in_RDI->_vptr_Propagator = (_func_int **)&PTR__BinGE_0031f0c0;
  this_00 = in_RDI + 1;
  in_RDI[1]._vptr_Propagator = in_RSI;
  in_RDI[1].prop_id = (int)in_RDX;
  in_RDI[1].priority = (int)((ulong)in_RDX >> 0x20);
  in_RDI[1].satisfied = (Tchar)(char)in_RCX;
  in_RDI[1].in_queue = (bool)(char)((ulong)in_RCX >> 8);
  *(int6 *)&in_RDI[1].field_0x12 = (int6)((ulong)in_RCX >> 0x10);
  in_RDI[2]._vptr_Propagator = in_R8;
  p = (Propagator *)&in_RDI[2].prop_id;
  BoolView::BoolView((BoolView *)in_R9,in_stack_ffffffffffffff98);
  IntView<0>::attach((IntView<0> *)in_stack_ffffffffffffffc0,in_RDI,(int)((ulong)this_00 >> 0x20),
                     (int)this_00);
  IntView<4>::attach(in_stack_ffffffffffffffc0,in_RDI,(int)((ulong)this_00 >> 0x20),(int)this_00);
  BoolView::attach((BoolView *)this_00,p,(int)((ulong)in_R9 >> 0x20),(int)in_R9);
  return;
}

Assistant:

BinGE(IntView<U> _x, IntView<V> _y, BoolView _r = bv_true) : x(_x), y(_y), r(std::move(_r)) {
		x.attach(this, 0, EVENT_U);
		y.attach(this, 1, EVENT_L);
		if (R != 0) {
			r.attach(this, 2, EVENT_L);
		}
	}